

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O2

int sbisect(int np,poly *sseq,double min,double max,int atmin,int atmax,double *roots)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  double in_XMM2_Qa;
  double dVar9;
  double in_XMM4_Qa;
  
  while (atmin - atmax != 1) {
    uVar5 = 0;
    iVar6 = 800;
    uVar3 = 0;
    dVar8 = min;
    while( true ) {
      dVar9 = dVar8;
      bVar7 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar7) {
        fwrite("sbisect: roots too close together\n",0x22,1,_stderr);
        fprintf(_stderr,
                "sbisect: overflow min %f max %f diff %e\t\t\t\t\t\t                      nroot %d n1 %d n2 %d\n"
                ,dVar9,max,max - dVar9,(ulong)(uint)(atmin - atmax),uVar5,uVar3);
        for (lVar2 = (long)atmax; lVar2 < atmin; lVar2 = lVar2 + 1) {
          *roots = in_XMM2_Qa;
          roots = roots + 1;
        }
        return 1;
      }
      min = (max + dVar9) * 0.5;
      iVar1 = numchanges(np,sseq,min);
      uVar4 = atmin - iVar1;
      uVar5 = (ulong)uVar4;
      uVar3 = (ulong)(uint)(iVar1 - atmax);
      if (iVar1 - atmax != 0 && uVar4 != 0) break;
      dVar8 = min;
      in_XMM2_Qa = min;
      if (uVar4 != 0) {
        dVar8 = dVar9;
        max = min;
      }
    }
    sbisect(np,sseq,dVar9,min,atmin,iVar1,roots);
    roots = roots + (int)uVar4;
    atmin = iVar1;
  }
  iVar6 = modrf(sseq->ord,sseq->coef,min,max,roots);
  if (iVar6 == 0) {
    iVar6 = 800;
    while( true ) {
      dVar8 = min;
      dVar9 = max - dVar8;
      bVar7 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar7) break;
      in_XMM4_Qa = (max + dVar8) * 0.5;
      iVar1 = numchanges(np,sseq,in_XMM4_Qa);
      if (1e-12 < ABS(in_XMM4_Qa)) {
        dVar9 = dVar9 / in_XMM4_Qa;
      }
      if (ABS(dVar9) < 1e-12) goto LAB_0016596b;
      min = in_XMM4_Qa;
      if (iVar1 != atmin) {
        min = dVar8;
        max = in_XMM4_Qa;
      }
    }
    fprintf(_stderr,
            "sbisect: overflow min %f max %f\t\t\t\t\t\t\t                         diff %e nroot %d n1 %d n2 %d\n"
            ,1,0,0);
LAB_0016596b:
    *roots = in_XMM4_Qa;
  }
  return 1;
}

Assistant:

int sbisect(int np, poly *sseq,
	double min, double max,
	int atmin, int atmax,
	double *roots)
{
	double mid;
	int atmid;
	int its;
	int  n1 = 0, n2 = 0;
	int nroot = atmin - atmax;

	if (nroot == 1) {

		/* first try a less expensive technique.  */
		if (modrf(sseq->ord, sseq->coef, min, max, &roots[0]))
			return 1;

		/*
		* if we get here we have to evaluate the root the hard
		* way by using the Sturm sequence.
		*/
		for (its = 0; its < MAXIT; its++) {
			mid = (double)((min + max) / 2);
			atmid = numchanges(np, sseq, mid);

			if (fabs(mid) > RELERROR) {
				if (fabs((max - min) / mid) < RELERROR) {
					roots[0] = mid;
					return 1;
				}
			}
			else if (fabs(max - min) < RELERROR) {
				roots[0] = mid;
				return 1;
			}

			if ((atmin - atmid) == 0)
				min = mid;
			else
				max = mid;
		}

		if (its == MAXIT) {
			fprintf(stderr, "sbisect: overflow min %f max %f\
							                         diff %e nroot %d n1 %d n2 %d\n",
													 min, max, max - min, nroot, n1, n2);
			roots[0] = mid;
		}

		return 1;
	}

	/* more than one root in the interval, we have to bisect */
	for (its = 0; its < MAXIT; its++) {

		mid = (double)((min + max) / 2);
		atmid = numchanges(np, sseq, mid);

		n1 = atmin - atmid;
		n2 = atmid - atmax;

		if (n1 != 0 && n2 != 0) {
			sbisect(np, sseq, min, mid, atmin, atmid, roots);
			sbisect(np, sseq, mid, max, atmid, atmax, &roots[n1]);
			break;
		}

		if (n1 == 0)
			min = mid;
		else
			max = mid;
	}

	if (its == MAXIT) {
		fprintf(stderr, "sbisect: roots too close together\n");
		fprintf(stderr, "sbisect: overflow min %f max %f diff %e\
						                      nroot %d n1 %d n2 %d\n",
											  min, max, max - min, nroot, n1, n2);
		for (n1 = atmax; n1 < atmin; n1++)
			roots[n1 - atmax] = mid;
	}

	return 1;
}